

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DependenceGraph.h
# Opt level: O0

int __thiscall dg::DependenceGraphBase::unref(DependenceGraphBase *this,bool deleteOnZero)

{
  byte in_SIL;
  long *in_RDI;
  int local_4;
  
  *(int *)(in_RDI + 1) = (int)in_RDI[1] + -1;
  if (((in_SIL & 1) == 0) || ((int)in_RDI[1] != 0)) {
    local_4 = (int)in_RDI[1];
  }
  else {
    if (in_RDI != (long *)0x0) {
      (**(code **)(*in_RDI + 8))();
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int unref(bool deleteOnZero = true) {
        --refcount;

        if (deleteOnZero && refcount == 0) {
            delete this;
            return 0;
        }

        assert(refcount >= 0 && "Negative refcount");
        return refcount;
    }